

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

MetaIterator * __thiscall rtosc::Port::MetaIterator::operator++(MetaIterator *this)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  
  if ((this->title == (char *)0x0) || (*this->title == '\0')) {
    this->title = (char *)0x0;
    return this;
  }
  cVar3 = '\0';
  pcVar2 = this->title;
  while ((pcVar1 = pcVar2 + 1, cVar3 != '\0' || ((cVar3 = *pcVar2, cVar3 != '\0' && (cVar3 != ':')))
         )) {
    this->title = pcVar1;
    cVar3 = *pcVar2;
    pcVar2 = pcVar1;
  }
  if (cVar3 == '\0') {
    pcVar1 = (char *)0x0;
  }
  this->title = pcVar1;
  if ((cVar3 != '\0') && (*pcVar1 != '\0')) {
    do {
      pcVar2 = pcVar1;
      this->value = pcVar2;
      pcVar1 = pcVar2 + 1;
    } while (*pcVar2 != '\0');
    this->value = pcVar1;
    if (*pcVar1 == '=') {
      this->value = pcVar2 + 2;
      return this;
    }
  }
  this->value = (char *)0x0;
  return this;
}

Assistant:

Port::MetaIterator& Port::MetaIterator::operator++(void)
{
    if(!title || !*title) {
        title = NULL;
        return *this;
    }
    //search for next parameter start
    //aka "\0:" unless "\0\0" is seen
    char prev = 0;
    while(prev || (*title && *title != ':'))
        prev = *title++;

    if(!*title)
        title = NULL;
    else
        ++title;

    metaiterator_advance(title, value);
    return *this;
}